

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

void Flatten(ON_PolyCurve *poly,ON_Interval pdom,ON_SimpleArray<double> *new_t,
            ON_SimpleArray<ON_Curve_*> *new_seg)

{
  int iVar1;
  double *pdVar2;
  ON_PolyCurve *poly_00;
  double dVar3;
  ON_Interval local_a0;
  ON_PolyCurve *local_90;
  ON_PolyCurve *spoly;
  ON_Curve *seg;
  double t1;
  double ndom;
  double local_60;
  double sdom;
  undefined1 auStack_50 [4];
  int i;
  ON_Interval pcdom;
  double t0;
  int n;
  ON_SimpleArray<ON_Curve_*> *new_seg_local;
  ON_SimpleArray<double> *new_t_local;
  ON_PolyCurve *poly_local;
  ON_Interval pdom_local;
  
  dVar3 = pdom.m_t[1];
  poly_local = pdom.m_t[0];
  pdom_local.m_t[0] = dVar3;
  iVar1 = ON_PolyCurve::Count(poly);
  pdVar2 = ON_Interval::operator[]((ON_Interval *)&poly_local,0);
  pcdom.m_t[1] = *pdVar2;
  (*(poly->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pcdom.m_t[0] = dVar3;
  for (sdom._4_4_ = 0; sdom._4_4_ < iVar1; sdom._4_4_ = sdom._4_4_ + 1) {
    _ndom = ON_PolyCurve::SegmentDomain(poly,sdom._4_4_);
    pdVar2 = ON_Interval::operator[]((ON_Interval *)&ndom,1);
    local_60 = *pdVar2;
    t1 = ON_Interval::NormalizedParameterAt((ON_Interval *)auStack_50,local_60);
    seg = (ON_Curve *)ON_Interval::ParameterAt((ON_Interval *)&poly_local,t1);
    spoly = (ON_PolyCurve *)ON_PolyCurve::SegmentCurve(poly,sdom._4_4_);
    poly_00 = ON_PolyCurve::Cast((ON_Object *)spoly);
    local_90 = poly_00;
    if (poly_00 == (ON_PolyCurve *)0x0) {
      ON_SimpleArray<double>::Append(new_t,(double *)&seg);
      ON_SimpleArray<ON_Curve_*>::Append(new_seg,(ON_Curve **)&spoly);
      ON_PolyCurve::HarvestSegment(poly,sdom._4_4_);
    }
    else {
      ON_Interval::ON_Interval(&local_a0,pcdom.m_t[1],(double)seg);
      Flatten(poly_00,local_a0,new_t,new_seg);
      ON_PolyCurve::HarvestSegment(poly,sdom._4_4_);
      if (local_90 != (ON_PolyCurve *)0x0) {
        (*(local_90->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
    }
    pcdom.m_t[1] = (double)seg;
  }
  return;
}

Assistant:

static
void Flatten( ON_PolyCurve* poly, ON_Interval pdom, ON_SimpleArray<double>& new_t, ON_SimpleArray<ON_Curve*>& new_seg){
		int n= poly->Count();
		double t0 = pdom[0];
		ON_Interval pcdom = poly->Domain();
		for(int i=0; i<n; i++){
			double sdom=poly->SegmentDomain(i)[1];
			double ndom=pcdom.NormalizedParameterAt(sdom);	
			double t1 =pdom.ParameterAt(ndom);
			ON_Curve* seg = poly->SegmentCurve(i);
			ON_PolyCurve* spoly =  ON_PolyCurve::Cast(seg);
			if(spoly){
				Flatten(spoly, ON_Interval(t0,t1), new_t, new_seg );
				poly->HarvestSegment(i);		
				delete spoly;
			} else {
				new_t.Append(t1);
				new_seg.Append(seg);
				poly->HarvestSegment(i);
			}
			t0 = t1;
		}
}